

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_messages(void)

{
  uint16_t v;
  char *str;
  undefined2 local_c;
  undefined2 local_a;
  uint16_t num;
  int16_t i;
  
  local_c = messages_num();
  if (0x50 < local_c) {
    local_c = 0x50;
  }
  wr_u16b(local_c);
  while (local_a = local_c - 1, -1 < (short)local_a) {
    str = message_str(local_a);
    wr_string(str);
    v = message_type(local_a);
    wr_u16b(v);
    local_c = local_a;
  }
  return;
}

Assistant:

void wr_messages(void)
{
	int16_t i;
	uint16_t num;

	num = messages_num();
	if (num > 80) num = 80;
	wr_u16b(num);

	/* Dump the messages (oldest first!) */
	for (i = num - 1; i >= 0; i--) {
		wr_string(message_str(i));
		wr_u16b(message_type(i));
	}
}